

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonProcessingFunctions.cpp
# Opt level: O0

bool helics::fileops::looksLikeConfigJson(string_view jsonString)

{
  string_view jsonString_00;
  size_type sVar1;
  size_type sVar2;
  const_reference pvVar3;
  char *pcVar4;
  basic_string_view<char,_std::char_traits<char>_> *this;
  string_view sVar5;
  string_view afterBracket;
  size_type closeBracket;
  size_type firstColonLoc;
  size_type firstQuote;
  char in_stack_ffffffffffffff8f;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff90;
  basic_string_view<char,_std::char_traits<char>_> in_stack_ffffffffffffffa0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  size_t local_28;
  char *local_20;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  bool local_1;
  
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffb0,
                     in_stack_ffffffffffffffa0._M_str,in_stack_ffffffffffffffa0._M_len);
  if (sVar1 == 0xffffffffffffffff) {
    sVar5._M_str = in_stack_ffffffffffffffc0;
    sVar5._M_len = in_stack_ffffffffffffffb8;
    sVar5 = removeSpaceAndComment(sVar5);
    local_28 = sVar5._M_len;
    local_18._M_len = local_28;
    local_20 = sVar5._M_str;
    local_18._M_str = local_20;
    sVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
    if (sVar2 < 7) {
      local_1 = false;
    }
    else {
      pvVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::front(&local_18);
      if (*pvVar3 == '{') {
        pcVar4 = (char *)CLI::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                                   (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa0._M_str,
                                    in_stack_ffffffffffffffa0._M_len);
        if (pcVar4 == (char *)0xffffffffffffffff) {
          local_1 = false;
        }
        else {
          sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f,0x634bb9);
          if (sVar1 == 0xffffffffffffffff) {
            local_1 = false;
          }
          else {
            this = (basic_string_view<char,_std::char_traits<char>_> *)
                   std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                             (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f,0x634be3);
            if (this == (basic_string_view<char,_std::char_traits<char>_> *)0xffffffffffffffff) {
              local_1 = false;
            }
            else {
              CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (this,(size_type)in_stack_ffffffffffffffa0._M_str,
                         in_stack_ffffffffffffffa0._M_len);
              jsonString_00._M_str = pcVar4;
              jsonString_00._M_len = sVar1;
              removeSpaceAndComment(jsonString_00);
              local_1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                                  ((basic_string_view<char,_std::char_traits<char>_> *)
                                   &stack0xffffffffffffffa0);
            }
          }
        }
      }
      else {
        local_1 = false;
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool looksLikeConfigJson(std::string_view jsonString)
{
    if (jsonString.find("\n#") != std::string_view::npos) {
        return false;
    }
    jsonString = removeSpaceAndComment(jsonString);
    if (jsonString.size() < 7) {
        // minimum viable config file is 7 characters {"f":4}
        return false;
    }

    if (jsonString.front() != '{') {
        return false;
    }
    auto firstQuote = jsonString.find_first_of("\"'");
    if (firstQuote == std::string_view::npos) {
        return false;
    }
    auto firstColonLoc = jsonString.find_first_of(':');
    if (firstColonLoc == std::string_view::npos) {
        return false;
    }
    auto closeBracket = jsonString.find_last_of('}');
    if (closeBracket == std::string_view::npos) {
        return false;
    }

    auto afterBracket = removeSpaceAndComment(jsonString.substr(closeBracket + 1));
    return afterBracket.empty();
}